

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZROT::GetSubBlockOffset(ChContactTriangleXYZROT *this)

{
  int in_ESI;
  
  GetSubBlockOffset((ChContactTriangleXYZROT *)
                    ((long)&(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                            _vptr_ChContactable +
                    (long)(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                          _vptr_ChContactable[-0xb]),in_ESI);
  return;
}

Assistant:

unsigned int ChContactTriangleXYZROT::GetSubBlockOffset(int nblock) {
    if (nblock == 0)
        return GetNode1()->NodeGetOffset_w();
    if (nblock == 1)
        return GetNode2()->NodeGetOffset_w();
    if (nblock == 2)
        return GetNode3()->NodeGetOffset_w();
    return 0;
}